

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O0

int __thiscall Program::getNextLineNumber(Program *this,int lineNumber)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_int,_Program::Line>_> local_28;
  iterator iter;
  int lineNumber_local;
  Program *this_local;
  
  iter._M_node._4_4_ = lineNumber;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_Program::Line,_std::less<int>,_std::allocator<std::pair<const_int,_Program::Line>_>_>
       ::find(&this->list_of_program,(key_type *)((long)&iter._M_node + 4));
  local_30 = (_Base_ptr)
             std::_Rb_tree_iterator<std::pair<const_int,_Program::Line>_>::operator++(&local_28,0);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_Program::Line,_std::less<int>,_std::allocator<std::pair<const_int,_Program::Line>_>_>
       ::end(&this->list_of_program);
  bVar1 = std::operator==(&local_28,&local_38);
  if (bVar1) {
    this_local._4_4_ = this->end_line;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_Program::Line>_>::operator->(&local_28);
    this_local._4_4_ = ppVar2->first;
  }
  return this_local._4_4_;
}

Assistant:

int Program::getNextLineNumber(int lineNumber) {
    auto iter = list_of_program.find(lineNumber);
    iter++;
    if (iter == list_of_program.end()) return end_line;
    return iter->first;
}